

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O2

bool CheckShader(GLuint handle,char *desc)

{
  undefined1 uVar1;
  undefined1 extraout_AL;
  int iVar2;
  GLint log_length;
  ImVector<char> buf;
  GLint status;
  GLint local_4c;
  ImVector<char> local_48;
  GLint local_2c;
  
  local_2c = 0;
  local_4c = 0;
  (*__glewGetShaderiv)(handle,0x8b81,&local_2c);
  uVar1 = (*__glewGetShaderiv)(handle,0x8b84,&local_4c);
  if ((char)local_2c == '\0') {
    iVar2 = fprintf(_stderr,"ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s!\n",
                    desc);
    uVar1 = (undefined1)iVar2;
  }
  if (1 < local_4c) {
    local_48.Size = 0;
    local_48.Capacity = 0;
    local_48.Data = (GLchar *)0x0;
    ImVector<char>::resize(&local_48,local_4c + 1);
    (*__glewGetShaderInfoLog)(handle,local_4c,(GLsizei *)0x0,local_48.Data);
    fprintf(_stderr,"%s\n",local_48.Data);
    ImVector<char>::~ImVector(&local_48);
    uVar1 = extraout_AL;
  }
  return (bool)uVar1;
}

Assistant:

static bool CheckShader(GLuint handle, const char* desc)
{
    GLint status = 0, log_length = 0;
    glGetShaderiv(handle, GL_COMPILE_STATUS, &status);
    glGetShaderiv(handle, GL_INFO_LOG_LENGTH, &log_length);
    if ((GLboolean)status == GL_FALSE)
        fprintf(stderr, "ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s!\n", desc);
    if (log_length > 1)
    {
        ImVector<char> buf;
        buf.resize((int)(log_length + 1));
        glGetShaderInfoLog(handle, log_length, NULL, (GLchar*)buf.begin());
        fprintf(stderr, "%s\n", buf.begin());
    }
    return (GLboolean)status == GL_TRUE;
}